

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,qint64 key)

{
  QCborValue *array;
  int iVar1;
  ulong uVar2;
  QCborContainerPrivate *pQVar4;
  QCborValueConstRef QVar5;
  QCborContainerPrivate *pQVar3;
  
  iVar1 = *(int *)(this + 0x10);
  array = this + 8;
  pQVar4 = *(QCborContainerPrivate **)(this + 8);
  if (key < 0 || iVar1 != 0x80) {
    if (iVar1 != 0xa0) {
      if (iVar1 == 0x80) {
LAB_002e2195:
        convertArrayToMap((QCborContainerPrivate **)array);
      }
      else {
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        *(undefined4 *)(this + 0x10) = 0xa0;
        if (pQVar4 != (QCborContainerPrivate *)0x0) {
          QCborContainerPrivate::deref(pQVar4);
        }
      }
    }
    *(undefined4 *)(this + 0x10) = 0xa0;
    *(undefined8 *)this = 0xffffffffffffffff;
    QVar5 = (QCborValueConstRef)
            QCborContainerPrivate::findOrAddMapKey<long_long>
                      (*(QCborContainerPrivate **)(this + 8),key);
    pQVar3 = QVar5.d;
    pQVar4 = *(QCborContainerPrivate **)(this + 8);
    if (pQVar4 != pQVar3) {
      if (pQVar4 != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(pQVar4);
      }
      if (pQVar3 != (QCborContainerPrivate *)0x0) {
        LOCK();
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(QCborContainerPrivate **)array = pQVar3;
    }
  }
  else {
    if (0xffff < (ulong)key) {
      if (pQVar4 == (QCborContainerPrivate *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (pQVar4->elements).d.size;
      }
      if (uVar2 < (ulong)key) goto LAB_002e2195;
    }
    pQVar4 = maybeGrow(pQVar4,key);
    QVar5.i = key;
    QVar5.d = pQVar4;
    *(QCborContainerPrivate **)array = pQVar4;
  }
  return (QCborValueRef)QVar5;
}

Assistant:

QCborValueRef QCborValue::operator[](qint64 key)
{
    if (shouldArrayRemainArray(key, t, container)) {
        container = maybeGrow(container, key);
        return { container, qsizetype(key) };
    }
    return QCborContainerPrivate::findOrAddMapKey(*this, key);
}